

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::detail::formatTruncated<std::__cxx11::string>
               (ostream *out,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,int ntrunc)

{
  string result;
  ostringstream tmp;
  long local_1b8 [4];
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,(string *)value);
  std::__cxx11::stringbuf::str();
  std::ostream::write((char *)out,local_1b8[0]);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

inline void formatTruncated(std::ostream& out, const T& value, int ntrunc)
{
    std::ostringstream tmp;
    tmp << value;
    std::string result = tmp.str();
    out.write(result.c_str(), (std::min)(ntrunc, static_cast<int>(result.size())));
}